

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>::templated_iterator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
::
emplace_new_key<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>
          (sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
          *key)

{
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *psVar1;
  size_type sVar2;
  void *pvVar3;
  pointer ppAVar4;
  sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
  sVar5;
  long lVar6;
  EntryPointer psVar7;
  void *pvVar8;
  EntryPointer psVar9;
  char cVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>::templated_iterator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_bool>
  pVar13;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __tmp_1;
  pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_48;
  pointer local_28;
  size_type sStack_20;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
       )distance_from_desired)) {
    psVar7 = (EntryPointer)(*(long *)(this + 0x18) + 1);
    auVar11._8_4_ = (int)((ulong)psVar7 >> 0x20);
    auVar11._0_8_ = psVar7;
    auVar11._12_4_ = 0x45300000;
    lVar6 = *(long *)(this + 8) + 1;
    auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar12._0_8_ = lVar6;
    auVar12._12_4_ = 0x45300000;
    if ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)psVar7) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) {
      cVar10 = current_entry->distance_from_desired;
      if (cVar10 < '\0') {
        (current_entry->field_1).value.second.size_ = (key->second).size_;
        ppAVar4 = (key->second).data_;
        (current_entry->field_1).value.first = key->first;
        (current_entry->field_1).value.second.data_ = ppAVar4;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar2 = (key->second).size_;
        pvVar3 = key->first;
        ppAVar4 = (key->second).data_;
        current_entry->distance_from_desired = distance_from_desired;
        pvVar8 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = pvVar3;
        local_48.second.data_ = (current_entry->field_1).value.second.data_;
        local_48.second.size_ = (current_entry->field_1).value.second.size_;
        (current_entry->field_1).value.second.data_ = ppAVar4;
        (current_entry->field_1).value.second.size_ = sVar2;
        sVar5 = (sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
                 )(cVar10 + '\x01');
        psVar7 = current_entry + 1;
        cVar10 = current_entry[1].distance_from_desired;
        psVar9 = current_entry;
        if (-1 < cVar10) {
          psVar1 = &(current_entry->field_1).value.second;
          do {
            psVar9 = psVar7;
            if (cVar10 < (char)sVar5) {
              psVar9->distance_from_desired = (int8_t)sVar5;
              pvVar3 = (psVar9->field_1).value.first;
              (psVar9->field_1).value.first = pvVar8;
              ppAVar4 = (psVar9->field_1).value.second.data_;
              sVar2 = (psVar9->field_1).value.second.size_;
              (psVar9->field_1).value.second.data_ = local_48.second.data_;
              (psVar9->field_1).value.second.size_ = local_48.second.size_;
              sVar5 = (sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
                       )(cVar10 + '\x01');
              pvVar8 = pvVar3;
              local_48.second.data_ = ppAVar4;
              local_48.second.size_ = sVar2;
            }
            else {
              sVar5 = (sherwood_v3_table<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,void_const*,slang::Hasher<void_const*>,ska::detailv3::KeyOrValueHasher<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,slang::Hasher<void_const*>>,std::equal_to<void_const*>,ska::detailv3::KeyOrValueEquality<void_const*,std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,std::equal_to<void_const*>>,std::allocator<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>>
                       )((char)sVar5 + '\x01');
              if (sVar5 == this[0x11]) {
                local_48.first = (current_entry->field_1).value.first;
                (current_entry->field_1).value.first = pvVar8;
                local_28 = local_48.second.data_;
                sStack_20 = local_48.second.size_;
                ppAVar4 = psVar1->data_;
                sVar2 = (current_entry->field_1).value.second.size_;
                psVar1->data_ = local_48.second.data_;
                (current_entry->field_1).value.second.size_ = local_48.second.size_;
                key = &local_48;
                local_48.second.data_ = ppAVar4;
                local_48.second.size_ = sVar2;
                goto LAB_0024581b;
              }
            }
            cVar10 = psVar9[1].distance_from_desired;
            psVar7 = psVar9 + 1;
          } while (-1 < cVar10);
        }
        psVar9[1].field_1.value.second.size_ = local_48.second.size_;
        psVar9[1].field_1.value.first = pvVar8;
        psVar9[1].field_1.value.second.data_ = local_48.second.data_;
        psVar7->distance_from_desired = (int8_t)sVar5;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      pVar13._9_7_ = (int7)((ulong)psVar7 >> 8);
      pVar13.second = true;
      pVar13.first.current = current_entry;
      return pVar13;
    }
  }
LAB_0024581b:
  sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_const_void_*,_slang::Hasher<const_void_*>,_ska::detailv3::KeyOrValueHasher<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::Hasher<const_void_*>_>,_std::equal_to<const_void_*>,_ska::detailv3::KeyOrValueEquality<const_void_*,_std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_std::equal_to<const_void_*>_>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>_>
          *)this);
  pVar13 = emplace<std::pair<void_const*,nonstd::span_lite::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>
                     (this,key);
  return pVar13;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }